

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

bool bloaty::DoParseOptions
               (bool skip_unknown,int *argc,char ***argv,Options *options,
               OutputOptions *output_options)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  string_view prefix;
  ConvertibleToStringView text;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  string_view text_00;
  string_view flag;
  string_view flag_00;
  string_view flag_01;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view flag_02;
  string_view flag_03;
  string_view flag_04;
  string_view flag_05;
  string_view flag_06;
  string_view flag_07;
  string_view flag_08;
  string_view format_04;
  string_view flag_09;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view s;
  string_view value_02;
  string_view value_03;
  FILE *__stream;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  byte bVar7;
  bool bVar8;
  int iVar9;
  string *psVar10;
  undefined8 uVar11;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  byte in_DIL;
  undefined4 *in_R8;
  string_view sVar12;
  string_view sVar13;
  string_view sVar14;
  DataSourceDefinition *source;
  DataSourceDefinition *__end23;
  DataSourceDefinition *__begin23;
  DataSourceDefinition (*__range23) [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  iterator __end8;
  iterator __begin8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  IstreamInputStream stream;
  ifstream input_file;
  bool has_domain;
  uint64_t uint64_option;
  int int_option;
  string_view option;
  ArgParser args;
  bool saw_separator;
  undefined4 in_stack_fffffffffffff488;
  Options_Demangle in_stack_fffffffffffff48c;
  uint in_stack_fffffffffffff490;
  undefined4 in_stack_fffffffffffff494;
  undefined2 in_stack_fffffffffffff498;
  undefined1 in_stack_fffffffffffff49a;
  undefined1 in_stack_fffffffffffff49b;
  int in_stack_fffffffffffff49c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff4a0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff4a8;
  undefined7 in_stack_fffffffffffff4b0;
  char in_stack_fffffffffffff4b7;
  size_t in_stack_fffffffffffff4b8;
  Arg *pAVar15;
  allocator<char> *in_stack_fffffffffffff4c0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff4c8;
  ArgParser *in_stack_fffffffffffff4d0;
  char *in_stack_fffffffffffff4e8;
  Options *in_stack_fffffffffffff4f0;
  undefined1 in_stack_fffffffffffff590;
  allocator<char> in_stack_fffffffffffff597;
  ArgParser *in_stack_fffffffffffff598;
  char *in_stack_fffffffffffff5a0;
  char *in_stack_fffffffffffff5a8;
  uint64_t *in_stack_fffffffffffff5b0;
  ArgParser *in_stack_fffffffffffff5b8;
  string_view in_stack_fffffffffffff5c0;
  size_t in_stack_fffffffffffff5d0;
  ArgParser *in_stack_fffffffffffff5d8;
  string_view in_stack_fffffffffffff5e0;
  Arg local_9f0 [2];
  string_view local_980;
  undefined4 local_950;
  allocator<char> local_949;
  string local_948 [32];
  string local_928 [32];
  undefined *local_908;
  undefined *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  allocator<char> local_891;
  string local_890 [55];
  allocator<char> local_859;
  string local_858 [48];
  size_t local_828;
  char *pcStack_820;
  Arg local_818 [2];
  size_t local_7a8;
  char *local_7a0;
  size_t local_788;
  char *local_780;
  size_t local_768;
  char *local_760;
  size_t local_748;
  char *pcStack_740;
  Arg local_738 [2];
  size_t local_6c8;
  char *local_6c0;
  size_t local_6a8;
  char *local_6a0;
  size_t local_688;
  char *local_680;
  allocator<char> local_651;
  string local_650 [87];
  allocator<char> local_5f9;
  string local_5f8 [48];
  size_t local_5c8;
  char *pcStack_5c0;
  Arg local_5b8 [2];
  size_t local_548;
  char *local_540;
  size_t local_528;
  char *local_520;
  size_t local_508;
  char *local_500;
  reference local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4c8;
  undefined1 *local_4c0;
  size_t local_4b8;
  char *pcStack_4b0;
  ConvertibleToStringView local_4a8 [2];
  undefined1 local_480 [40];
  size_t local_458;
  char *pcStack_450;
  Arg local_448 [3];
  size_t local_398;
  char *pcStack_390;
  Arg local_380 [2];
  allocator<char> local_319;
  string local_318 [32];
  undefined1 local_2f8 [623];
  byte local_89;
  int local_7c;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  ArgParser local_68;
  byte local_29;
  undefined4 *local_28;
  basic_string_view<char,_std::char_traits<char>_> *local_20;
  byte local_2;
  byte local_1;
  
  local_2 = in_DIL & 1;
  local_29 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  ArgParser::ArgParser
            (in_stack_fffffffffffff4d0,(int *)in_stack_fffffffffffff4c8,
             (char ***)in_stack_fffffffffffff4c0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78);
  sVar14._M_str = in_stack_fffffffffffff5a0;
  sVar14._M_len = in_stack_fffffffffffff4b8;
  sVar13._M_str = (char *)in_stack_fffffffffffff4d0;
  sVar13._M_len = in_stack_fffffffffffff5d0;
  local_89 = 0;
LAB_0018e97d:
  do {
    uVar1 = ArgParser::IsDone(&local_68);
    if (((uVar1 ^ 0xff) & 1) == 0) {
      iVar9 = Options::data_source_size((Options *)0x190574);
      if (iVar9 == 0) {
        bVar8 = Options::has_disassemble_function((Options *)0x190590);
        if (!bVar8) {
          Options::add_data_source(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
        }
      }
      if ((local_89 & 1) != 0) {
        bVar8 = Options::has_sort_by((Options *)0x1905d3);
        if (!bVar8) {
          iVar9 = local_28[4];
          if (iVar9 == 0) {
            Options::set_sort_by
                      ((Options *)(ulong)in_stack_fffffffffffff490,in_stack_fffffffffffff48c);
          }
          else if (iVar9 == 1) {
            Options::set_sort_by
                      ((Options *)CONCAT44(1,in_stack_fffffffffffff490),in_stack_fffffffffffff48c);
          }
          else if (iVar9 == 2) {
            Options::set_sort_by
                      ((Options *)CONCAT44(2,in_stack_fffffffffffff490),in_stack_fffffffffffff48c);
          }
        }
      }
      local_1 = 1;
LAB_00190662:
      local_950 = 1;
      ArgParser::~ArgParser((ArgParser *)0x19066f);
      return (bool)(local_1 & 1);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff4a0,
               (char *)CONCAT44(in_stack_fffffffffffff49c,
                                CONCAT13(in_stack_fffffffffffff49b,
                                         CONCAT12(in_stack_fffffffffffff49a,
                                                  in_stack_fffffffffffff498))));
    sVar12._M_str = (char *)in_stack_fffffffffffff4c8;
    sVar12._M_len = (size_t)in_stack_fffffffffffff4c0;
    uVar2 = ArgParser::TryParseFlag((ArgParser *)sVar14._M_len,sVar12);
    if (!(bool)uVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff4a0,
                 (char *)CONCAT44(in_stack_fffffffffffff49c,
                                  CONCAT13(in_stack_fffffffffffff49b,
                                           CONCAT12(in_stack_fffffffffffff49a,
                                                    in_stack_fffffffffffff498))));
      flag._M_str = (char *)in_stack_fffffffffffff4c8;
      flag._M_len = (size_t)in_stack_fffffffffffff4c0;
      uVar3 = ArgParser::TryParseFlag((ArgParser *)sVar14._M_len,flag);
      if ((bool)uVar3) {
        *local_28 = 1;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffff4a0,
                   (char *)CONCAT44(in_stack_fffffffffffff49c,
                                    CONCAT13(in_stack_fffffffffffff49b,
                                             CONCAT12(in_stack_fffffffffffff49a,
                                                      in_stack_fffffffffffff498))));
        flag_00._M_str = (char *)in_stack_fffffffffffff4c8;
        flag_00._M_len = (size_t)in_stack_fffffffffffff4c0;
        uVar4 = ArgParser::TryParseFlag((ArgParser *)sVar14._M_len,flag_00);
        if ((bool)uVar4) {
          *local_28 = 2;
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffff4a0,
                     (char *)CONCAT44(in_stack_fffffffffffff49c,
                                      CONCAT13(in_stack_fffffffffffff49b,
                                               CONCAT12(in_stack_fffffffffffff49a,
                                                        in_stack_fffffffffffff498))));
          flag_01._M_str = (char *)in_stack_fffffffffffff4c8;
          flag_01._M_len = (size_t)in_stack_fffffffffffff4c0;
          uVar5 = ArgParser::TryParseFlag((ArgParser *)sVar14._M_len,flag_01);
          if ((bool)uVar5) {
            Options::set_dump_raw_map
                      ((Options *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                       SUB41(in_stack_fffffffffffff48c >> 0x18,0));
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffff4a0,
                       (char *)CONCAT44(in_stack_fffffffffffff49c,
                                        CONCAT13(in_stack_fffffffffffff49b,
                                                 CONCAT12(in_stack_fffffffffffff49a,
                                                          in_stack_fffffffffffff498))));
            uVar6 = ArgParser::TryParseOption
                              (in_stack_fffffffffffff5d8,in_stack_fffffffffffff5e0,
                               (string_view *)sVar13._M_len);
            if ((bool)uVar6) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         sVar13._M_str,in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
              std::ifstream::ifstream(local_2f8,local_318,_S_in);
              std::__cxx11::string::~string(local_318);
              std::allocator<char>::~allocator(&local_319);
              bVar7 = std::ifstream::is_open();
              pAVar15 = (Arg *)sVar14._M_len;
              if ((bVar7 & 1) == 0) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffff4a0,
                           (char *)CONCAT44(in_stack_fffffffffffff49c,
                                            CONCAT13(in_stack_fffffffffffff49b,
                                                     CONCAT12(in_stack_fffffffffffff49a,
                                                              in_stack_fffffffffffff498))));
                local_398 = local_78._M_len;
                pcStack_390 = local_78._M_str;
                value_03._M_str = local_78._M_str;
                value_03._M_len = local_78._M_len;
                absl::substitute_internal::Arg::Arg(local_380,value_03);
                format._M_str = (char *)in_stack_fffffffffffff4c8;
                format._M_len = (size_t)in_stack_fffffffffffff4c0;
                absl::Substitute_abi_cxx11_(format,pAVar15);
                std::__cxx11::string::c_str();
                Throw((char *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff49c);
              }
              google::protobuf::io::IstreamInputStream::IstreamInputStream
                        ((IstreamInputStream *)
                         CONCAT17(in_stack_fffffffffffff4b7,in_stack_fffffffffffff4b0),
                         (istream *)in_stack_fffffffffffff4a8,
                         (int)((ulong)in_stack_fffffffffffff4a0 >> 0x20));
              bVar8 = google::protobuf::TextFormat::Merge
                                ((ZeroCopyInputStream *)sVar13._M_str,
                                 (Message *)in_stack_fffffffffffff4c8);
              pAVar15 = (Arg *)sVar14._M_len;
              if (!bVar8) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffff4a0,
                           (char *)CONCAT44(in_stack_fffffffffffff49c,
                                            CONCAT13(in_stack_fffffffffffff49b,
                                                     CONCAT12(in_stack_fffffffffffff49a,
                                                              in_stack_fffffffffffff498))));
                local_458 = local_78._M_len;
                pcStack_450 = local_78._M_str;
                value_02._M_str = local_78._M_str;
                value_02._M_len = local_78._M_len;
                absl::substitute_internal::Arg::Arg(local_448,value_02);
                format_00._M_str = (char *)in_stack_fffffffffffff4c8;
                format_00._M_len = (size_t)in_stack_fffffffffffff4c0;
                absl::Substitute_abi_cxx11_(format_00,pAVar15);
                std::__cxx11::string::c_str();
                Throw((char *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff49c);
              }
              google::protobuf::io::IstreamInputStream::~IstreamInputStream
                        ((IstreamInputStream *)
                         CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
              std::ifstream::~ifstream(local_2f8);
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffff4a0,
                         (char *)CONCAT44(in_stack_fffffffffffff49c,
                                          CONCAT13(in_stack_fffffffffffff49b,
                                                   CONCAT12(in_stack_fffffffffffff49a,
                                                            in_stack_fffffffffffff498))));
              bVar8 = ArgParser::TryParseOption
                                (in_stack_fffffffffffff5d8,in_stack_fffffffffffff5e0,
                                 (string_view *)sVar13._M_len);
              if (bVar8) {
                local_4b8 = local_78._M_len;
                pcStack_4b0 = local_78._M_str;
                s._M_str = local_78._M_str;
                s._M_len = local_78._M_len;
                absl::strings_internal::ConvertibleToStringView::ConvertibleToStringView
                          (local_4a8,s);
                text.value_._M_str = (char *)in_stack_fffffffffffff4c0;
                text.value_._M_len = sVar14._M_len;
                absl::StrSplit<char>(text,in_stack_fffffffffffff4b7);
                absl::strings_internal::
                Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                ::
                operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                          ((Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                            *)CONCAT44(in_stack_fffffffffffff49c,
                                       CONCAT13(in_stack_fffffffffffff49b,
                                                CONCAT12(in_stack_fffffffffffff49a,
                                                         in_stack_fffffffffffff498))));
                local_4c0 = local_480;
                local_4c8._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
                local_4d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
                while( true ) {
                  bVar8 = __gnu_cxx::operator!=
                                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490
                                                ),
                                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488
                                                ));
                  if (!bVar8) break;
                  local_4d8 = __gnu_cxx::
                              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*(&local_4c8);
                  Options::add_data_source
                            ((Options *)
                             CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                             (string *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488)
                            );
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_4c8);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff4a0);
              }
              else {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffff4a0,
                           (char *)CONCAT44(in_stack_fffffffffffff49c,
                                            CONCAT13(in_stack_fffffffffffff49b,
                                                     CONCAT12(in_stack_fffffffffffff49a,
                                                              in_stack_fffffffffffff498))));
                bVar8 = ArgParser::TryParseOption
                                  (in_stack_fffffffffffff5d8,in_stack_fffffffffffff5e0,
                                   (string_view *)sVar13._M_len);
                if (!bVar8) {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffff4a0,
                             (char *)CONCAT44(in_stack_fffffffffffff49c,
                                              CONCAT13(in_stack_fffffffffffff49b,
                                                       CONCAT12(in_stack_fffffffffffff49a,
                                                                in_stack_fffffffffffff498))));
                  bVar8 = ArgParser::TryParseOption
                                    (in_stack_fffffffffffff5d8,in_stack_fffffffffffff5e0,
                                     (string_view *)sVar13._M_len);
                  if (!bVar8) {
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (in_stack_fffffffffffff4a0,
                               (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                CONCAT13(in_stack_fffffffffffff49b,
                                                         CONCAT12(in_stack_fffffffffffff49a,
                                                                  in_stack_fffffffffffff498))));
                    bVar8 = ArgParser::TryParseOption
                                      (in_stack_fffffffffffff5d8,in_stack_fffffffffffff5e0,
                                       (string_view *)sVar13._M_len);
                    if (bVar8) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::
                      string<std::basic_string_view<char,std::char_traits<char>>,void>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)sVar13._M_str,in_stack_fffffffffffff4c8,
                                 in_stack_fffffffffffff4c0);
                      Options::add_debug_filename
                                ((Options *)
                                 CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                                 (string *)
                                 CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
                      std::__cxx11::string::~string(local_5f8);
                      std::allocator<char>::~allocator(&local_5f9);
                    }
                    else {
                      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                (in_stack_fffffffffffff4a0,
                                 (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                  CONCAT13(in_stack_fffffffffffff49b,
                                                           CONCAT12(in_stack_fffffffffffff49a,
                                                                    in_stack_fffffffffffff498))));
                      bVar8 = ArgParser::TryParseUint64Option
                                        (in_stack_fffffffffffff5b8,in_stack_fffffffffffff5c0,
                                         in_stack_fffffffffffff5b0);
                      if (bVar8) {
                        bVar8 = Options::has_debug_fileoff((Options *)0x18f42e);
                        if (bVar8) {
                          Throw((char *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff49c);
                        }
                        Options::set_debug_fileoff
                                  ((Options *)
                                   CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                                   CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
                      }
                      else {
                        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                  (in_stack_fffffffffffff4a0,
                                   (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                    CONCAT13(in_stack_fffffffffffff49b,
                                                             CONCAT12(in_stack_fffffffffffff49a,
                                                                      in_stack_fffffffffffff498))));
                        bVar8 = ArgParser::TryParseUint64Option
                                          (in_stack_fffffffffffff5b8,in_stack_fffffffffffff5c0,
                                           in_stack_fffffffffffff5b0);
                        if (bVar8) {
                          bVar8 = Options::has_debug_vmaddr((Options *)0x18f4cf);
                          if (bVar8) {
                            Throw((char *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff49c);
                          }
                          Options::set_debug_vmaddr
                                    ((Options *)
                                     CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                                     CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
                        }
                        else {
                          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                    (in_stack_fffffffffffff4a0,
                                     (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                      CONCAT13(in_stack_fffffffffffff49b,
                                                               CONCAT12(in_stack_fffffffffffff49a,
                                                                        in_stack_fffffffffffff498)))
                                    );
                          bVar8 = ArgParser::TryParseOption
                                            (in_stack_fffffffffffff5d8,in_stack_fffffffffffff5e0,
                                             (string_view *)sVar13._M_len);
                          if (bVar8) {
                            psVar10 = Options::mutable_disassemble_function_abi_cxx11_
                                                ((Options *)0x18f573);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::
                            string<std::basic_string_view<char,std::char_traits<char>>,void>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)sVar13._M_str,in_stack_fffffffffffff4c8,
                                       in_stack_fffffffffffff4c0);
                            std::__cxx11::string::assign((string *)psVar10);
                            std::__cxx11::string::~string(local_650);
                            std::allocator<char>::~allocator(&local_651);
                          }
                          else {
                            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                      (in_stack_fffffffffffff4a0,
                                       (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                        CONCAT13(in_stack_fffffffffffff49b,
                                                                 CONCAT12(in_stack_fffffffffffff49a,
                                                                          in_stack_fffffffffffff498)
                                                                )));
                            flag_09._M_str = in_stack_fffffffffffff5a8;
                            flag_09._M_len = (size_t)sVar14._M_str;
                            bVar8 = ArgParser::TryParseIntegerOption
                                              (in_stack_fffffffffffff598,flag_09,
                                               (int *)CONCAT17(in_stack_fffffffffffff597,
                                                               CONCAT16(uVar1,CONCAT15(uVar2,
                                                  CONCAT14(uVar3,CONCAT13(uVar4,CONCAT12(uVar5,
                                                  CONCAT11(uVar6,in_stack_fffffffffffff590))))))));
                            if (bVar8) {
                              if (local_7c == 0) {
                                Options::set_max_rows_per_level
                                          ((Options *)
                                           CONCAT44(in_stack_fffffffffffff494,
                                                    in_stack_fffffffffffff490),
                                           CONCAT44(in_stack_fffffffffffff48c,
                                                    in_stack_fffffffffffff488));
                              }
                              else {
                                Options::set_max_rows_per_level
                                          ((Options *)
                                           CONCAT44(in_stack_fffffffffffff494,
                                                    in_stack_fffffffffffff490),
                                           CONCAT44(in_stack_fffffffffffff48c,
                                                    in_stack_fffffffffffff488));
                              }
                            }
                            else {
                              std::basic_string_view<char,_std::char_traits<char>_>::
                              basic_string_view(in_stack_fffffffffffff4a0,
                                                (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                                 CONCAT13(in_stack_fffffffffffff49b,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff49a,
                                                  in_stack_fffffffffffff498))));
                              bVar8 = ArgParser::TryParseOption
                                                (in_stack_fffffffffffff5d8,in_stack_fffffffffffff5e0
                                                 ,(string_view *)sVar13._M_len);
                              if (bVar8) {
                                local_89 = 1;
                                local_688 = local_78._M_len;
                                local_680 = local_78._M_str;
                                std::basic_string_view<char,_std::char_traits<char>_>::
                                basic_string_view(in_stack_fffffffffffff4a0,
                                                  (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff49b,
                                                  CONCAT12(in_stack_fffffffffffff49a,
                                                           in_stack_fffffffffffff498))));
                                __x_02._M_str = (char *)in_stack_fffffffffffff4c0;
                                __x_02._M_len = sVar14._M_len;
                                __y_02._M_str._0_7_ = in_stack_fffffffffffff4b0;
                                __y_02._M_len = (size_t)in_stack_fffffffffffff4a8;
                                __y_02._M_str._7_1_ = in_stack_fffffffffffff4b7;
                                bVar8 = std::operator==(__x_02,__y_02);
                                if (bVar8) {
                                  local_28[4] = 1;
                                  show = 1;
                                }
                                else {
                                  local_6a8 = local_78._M_len;
                                  local_6a0 = local_78._M_str;
                                  std::basic_string_view<char,_std::char_traits<char>_>::
                                  basic_string_view(in_stack_fffffffffffff4a0,
                                                    (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffff49b,
                                                  CONCAT12(in_stack_fffffffffffff49a,
                                                           in_stack_fffffffffffff498))));
                                  __x_03._M_str = (char *)in_stack_fffffffffffff4c0;
                                  __x_03._M_len = sVar14._M_len;
                                  __y_03._M_str._0_7_ = in_stack_fffffffffffff4b0;
                                  __y_03._M_len = (size_t)in_stack_fffffffffffff4a8;
                                  __y_03._M_str._7_1_ = in_stack_fffffffffffff4b7;
                                  bVar8 = std::operator==(__x_03,__y_03);
                                  if (bVar8) {
                                    local_28[4] = 0;
                                    show = 0;
                                  }
                                  else {
                                    local_6c8 = local_78._M_len;
                                    local_6c0 = local_78._M_str;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(in_stack_fffffffffffff4a0,
                                                      (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                                       CONCAT13(
                                                  in_stack_fffffffffffff49b,
                                                  CONCAT12(in_stack_fffffffffffff49a,
                                                           in_stack_fffffffffffff498))));
                                    __x_04._M_str = (char *)in_stack_fffffffffffff4c0;
                                    __x_04._M_len = sVar14._M_len;
                                    __y_04._M_str._0_7_ = in_stack_fffffffffffff4b0;
                                    __y_04._M_len = (size_t)in_stack_fffffffffffff4a8;
                                    __y_04._M_str._7_1_ = in_stack_fffffffffffff4b7;
                                    bVar8 = std::operator==(__x_04,__y_04);
                                    pAVar15 = (Arg *)sVar14._M_len;
                                    if (!bVar8) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view(in_stack_fffffffffffff4a0,
                                                        (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffff49b,
                                                  CONCAT12(in_stack_fffffffffffff49a,
                                                           in_stack_fffffffffffff498))));
                                      local_748 = local_78._M_len;
                                      pcStack_740 = local_78._M_str;
                                      value_00._M_str = local_78._M_str;
                                      value_00._M_len = local_78._M_len;
                                      absl::substitute_internal::Arg::Arg(local_738,value_00);
                                      format_02._M_str = (char *)in_stack_fffffffffffff4c8;
                                      format_02._M_len = (size_t)in_stack_fffffffffffff4c0;
                                      absl::Substitute_abi_cxx11_(format_02,pAVar15);
                                      std::__cxx11::string::c_str();
                                      Throw((char *)in_stack_fffffffffffff4a0,
                                            in_stack_fffffffffffff49c);
                                    }
                                    local_28[4] = 2;
                                    show = 2;
                                  }
                                }
                              }
                              else {
                                std::basic_string_view<char,_std::char_traits<char>_>::
                                basic_string_view(in_stack_fffffffffffff4a0,
                                                  (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff49b,
                                                  CONCAT12(in_stack_fffffffffffff49a,
                                                           in_stack_fffffffffffff498))));
                                bVar8 = ArgParser::TryParseOption
                                                  (in_stack_fffffffffffff5d8,
                                                   in_stack_fffffffffffff5e0,
                                                   (string_view *)sVar13._M_len);
                                if (bVar8) {
                                  local_768 = local_78._M_len;
                                  local_760 = local_78._M_str;
                                  std::basic_string_view<char,_std::char_traits<char>_>::
                                  basic_string_view(in_stack_fffffffffffff4a0,
                                                    (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffff49b,
                                                  CONCAT12(in_stack_fffffffffffff49a,
                                                           in_stack_fffffffffffff498))));
                                  __x_05._M_str = (char *)in_stack_fffffffffffff4c0;
                                  __x_05._M_len = sVar14._M_len;
                                  __y_05._M_str._0_7_ = in_stack_fffffffffffff4b0;
                                  __y_05._M_len = (size_t)in_stack_fffffffffffff4a8;
                                  __y_05._M_str._7_1_ = in_stack_fffffffffffff4b7;
                                  bVar8 = std::operator==(__x_05,__y_05);
                                  if (bVar8) {
                                    Options::set_sort_by
                                              ((Options *)
                                               CONCAT44(in_stack_fffffffffffff494,
                                                        in_stack_fffffffffffff490),
                                               in_stack_fffffffffffff48c);
                                  }
                                  else {
                                    local_788 = local_78._M_len;
                                    local_780 = local_78._M_str;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(in_stack_fffffffffffff4a0,
                                                      (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                                       CONCAT13(
                                                  in_stack_fffffffffffff49b,
                                                  CONCAT12(in_stack_fffffffffffff49a,
                                                           in_stack_fffffffffffff498))));
                                    __x_06._M_str = (char *)in_stack_fffffffffffff4c0;
                                    __x_06._M_len = sVar14._M_len;
                                    __y_06._M_str._0_7_ = in_stack_fffffffffffff4b0;
                                    __y_06._M_len = (size_t)in_stack_fffffffffffff4a8;
                                    __y_06._M_str._7_1_ = in_stack_fffffffffffff4b7;
                                    bVar8 = std::operator==(__x_06,__y_06);
                                    if (bVar8) {
                                      Options::set_sort_by
                                                ((Options *)
                                                 CONCAT44(in_stack_fffffffffffff494,
                                                          in_stack_fffffffffffff490),
                                                 in_stack_fffffffffffff48c);
                                    }
                                    else {
                                      local_7a8 = local_78._M_len;
                                      local_7a0 = local_78._M_str;
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view(in_stack_fffffffffffff4a0,
                                                        (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffff49b,
                                                  CONCAT12(in_stack_fffffffffffff49a,
                                                           in_stack_fffffffffffff498))));
                                      __x_07._M_str = (char *)in_stack_fffffffffffff4c0;
                                      __x_07._M_len = sVar14._M_len;
                                      __y_07._M_str._0_7_ = in_stack_fffffffffffff4b0;
                                      __y_07._M_len = (size_t)in_stack_fffffffffffff4a8;
                                      __y_07._M_str._7_1_ = in_stack_fffffffffffff4b7;
                                      bVar8 = std::operator==(__x_07,__y_07);
                                      pAVar15 = (Arg *)sVar14._M_len;
                                      if (!bVar8) {
                                        std::basic_string_view<char,_std::char_traits<char>_>::
                                        basic_string_view(in_stack_fffffffffffff4a0,
                                                          (char *)CONCAT44(in_stack_fffffffffffff49c
                                                                           ,CONCAT13(
                                                  in_stack_fffffffffffff49b,
                                                  CONCAT12(in_stack_fffffffffffff49a,
                                                           in_stack_fffffffffffff498))));
                                        local_828 = local_78._M_len;
                                        pcStack_820 = local_78._M_str;
                                        value._M_str = local_78._M_str;
                                        value._M_len = local_78._M_len;
                                        absl::substitute_internal::Arg::Arg(local_818,value);
                                        format_03._M_str = (char *)in_stack_fffffffffffff4c8;
                                        format_03._M_len = (size_t)in_stack_fffffffffffff4c0;
                                        absl::Substitute_abi_cxx11_(format_03,pAVar15);
                                        std::__cxx11::string::c_str();
                                        Throw((char *)in_stack_fffffffffffff4a0,
                                              in_stack_fffffffffffff49c);
                                      }
                                      Options::set_sort_by
                                                ((Options *)
                                                 CONCAT44(in_stack_fffffffffffff494,
                                                          in_stack_fffffffffffff490),
                                                 in_stack_fffffffffffff48c);
                                    }
                                  }
                                }
                                else {
                                  std::basic_string_view<char,_std::char_traits<char>_>::
                                  basic_string_view(in_stack_fffffffffffff4a0,
                                                    (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffff49b,
                                                  CONCAT12(in_stack_fffffffffffff49a,
                                                           in_stack_fffffffffffff498))));
                                  bVar8 = ArgParser::TryParseOption
                                                    (in_stack_fffffffffffff5d8,
                                                     in_stack_fffffffffffff5e0,
                                                     (string_view *)sVar13._M_len);
                                  if (bVar8) {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::
                                    string<std::basic_string_view<char,std::char_traits<char>>,void>
                                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)sVar13._M_str,in_stack_fffffffffffff4c8,
                                               in_stack_fffffffffffff4c0);
                                    Options::set_source_filter
                                              ((Options *)
                                               CONCAT44(in_stack_fffffffffffff494,
                                                        in_stack_fffffffffffff490),
                                               (string *)
                                               CONCAT44(in_stack_fffffffffffff48c,
                                                        in_stack_fffffffffffff488));
                                    std::__cxx11::string::~string(local_858);
                                    std::allocator<char>::~allocator(&local_859);
                                  }
                                  else {
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(in_stack_fffffffffffff4a0,
                                                      (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                                       CONCAT13(
                                                  in_stack_fffffffffffff49b,
                                                  CONCAT12(in_stack_fffffffffffff49a,
                                                           in_stack_fffffffffffff498))));
                                    bVar8 = ArgParser::TryParseOption
                                                      (in_stack_fffffffffffff5d8,
                                                       in_stack_fffffffffffff5e0,
                                                       (string_view *)sVar13._M_len);
                                    if (bVar8) {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::
                                      string<std::basic_string_view<char,std::char_traits<char>>,void>
                                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sVar13._M_str,in_stack_fffffffffffff4c8,
                                                 in_stack_fffffffffffff4c0);
                                      Options::add_source_map
                                                ((Options *)
                                                 CONCAT44(in_stack_fffffffffffff494,
                                                          in_stack_fffffffffffff490),
                                                 (string *)
                                                 CONCAT44(in_stack_fffffffffffff48c,
                                                          in_stack_fffffffffffff488));
                                      std::__cxx11::string::~string(local_890);
                                      std::allocator<char>::~allocator(&local_891);
                                    }
                                    else {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view(in_stack_fffffffffffff4a0,
                                                        (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffff49b,
                                                  CONCAT12(in_stack_fffffffffffff49a,
                                                           in_stack_fffffffffffff498))));
                                      flag_02._M_str = (char *)in_stack_fffffffffffff4c8;
                                      flag_02._M_len = (size_t)in_stack_fffffffffffff4c0;
                                      bVar8 = ArgParser::TryParseFlag
                                                        ((ArgParser *)sVar14._M_len,flag_02);
                                      if (bVar8) {
                                        Options::set_verbose_level
                                                  ((Options *)
                                                   CONCAT44(in_stack_fffffffffffff494,
                                                            in_stack_fffffffffffff490),
                                                   in_stack_fffffffffffff48c);
                                      }
                                      else {
                                        std::basic_string_view<char,_std::char_traits<char>_>::
                                        basic_string_view(in_stack_fffffffffffff4a0,
                                                          (char *)CONCAT44(in_stack_fffffffffffff49c
                                                                           ,CONCAT13(
                                                  in_stack_fffffffffffff49b,
                                                  CONCAT12(in_stack_fffffffffffff49a,
                                                           in_stack_fffffffffffff498))));
                                        flag_03._M_str = (char *)in_stack_fffffffffffff4c8;
                                        flag_03._M_len = (size_t)in_stack_fffffffffffff4c0;
                                        bVar8 = ArgParser::TryParseFlag
                                                          ((ArgParser *)sVar14._M_len,flag_03);
                                        if (bVar8) {
                                          Options::set_verbose_level
                                                    ((Options *)
                                                     CONCAT44(in_stack_fffffffffffff494,
                                                              in_stack_fffffffffffff490),
                                                     in_stack_fffffffffffff48c);
                                        }
                                        else {
                                          std::basic_string_view<char,_std::char_traits<char>_>::
                                          basic_string_view(in_stack_fffffffffffff4a0,
                                                            (char *)CONCAT44(
                                                  in_stack_fffffffffffff49c,
                                                  CONCAT13(in_stack_fffffffffffff49b,
                                                           CONCAT12(in_stack_fffffffffffff49a,
                                                                    in_stack_fffffffffffff498))));
                                          flag_04._M_str = (char *)in_stack_fffffffffffff4c8;
                                          flag_04._M_len = (size_t)in_stack_fffffffffffff4c0;
                                          bVar8 = ArgParser::TryParseFlag
                                                            ((ArgParser *)sVar14._M_len,flag_04);
                                          if (bVar8) {
                                            Options::set_verbose_level
                                                      ((Options *)
                                                       CONCAT44(in_stack_fffffffffffff494,
                                                                in_stack_fffffffffffff490),
                                                       in_stack_fffffffffffff48c);
                                          }
                                          else {
                                            std::basic_string_view<char,_std::char_traits<char>_>::
                                            basic_string_view(in_stack_fffffffffffff4a0,
                                                              (char *)CONCAT44(
                                                  in_stack_fffffffffffff49c,
                                                  CONCAT13(in_stack_fffffffffffff49b,
                                                           CONCAT12(in_stack_fffffffffffff49a,
                                                                    in_stack_fffffffffffff498))));
                                            flag_05._M_str = (char *)in_stack_fffffffffffff4c8;
                                            flag_05._M_len = (size_t)in_stack_fffffffffffff4c0;
                                            bVar8 = ArgParser::TryParseFlag
                                                              ((ArgParser *)sVar14._M_len,flag_05);
                                            if (bVar8) {
                                              *(undefined8 *)(local_28 + 2) = 0xffffffffffffffff;
                                            }
                                            else {
                                              std::basic_string_view<char,_std::char_traits<char>_>
                                              ::basic_string_view(in_stack_fffffffffffff4a0,
                                                                  (char *)CONCAT44(
                                                  in_stack_fffffffffffff49c,
                                                  CONCAT13(in_stack_fffffffffffff49b,
                                                           CONCAT12(in_stack_fffffffffffff49a,
                                                                    in_stack_fffffffffffff498))));
                                              flag_06._M_str = (char *)in_stack_fffffffffffff4c8;
                                              flag_06._M_len = (size_t)in_stack_fffffffffffff4c0;
                                              bVar8 = ArgParser::TryParseFlag
                                                                ((ArgParser *)sVar14._M_len,flag_06)
                                              ;
                                              if (bVar8) {
                                                local_8f0 = data_sources;
                                                local_900 = &MmapInputFile::vtable;
                                                for (local_8f8 = data_sources; __stream = _stderr,
                                                    local_8f8 != local_900;
                                                    local_8f8 = local_8f8 + 0x18) {
                                                  local_908 = local_8f8;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sVar13._M_str,(char *)in_stack_fffffffffffff4c8,
                                                  in_stack_fffffffffffff4c0);
                                                  anon_unknown_33::FixedWidthString
                                                            ((string *)sVar14._M_len,
                                                             CONCAT17(in_stack_fffffffffffff4b7,
                                                                      in_stack_fffffffffffff4b0));
                                                  uVar11 = std::__cxx11::string::c_str();
                                                  fprintf(__stream,"%s %s\n",uVar11,
                                                          *(undefined8 *)(local_908 + 0x10));
                                                  std::__cxx11::string::~string(local_928);
                                                  std::__cxx11::string::~string(local_948);
                                                  std::allocator<char>::~allocator(&local_949);
                                                }
                                                local_1 = 0;
                                                goto LAB_00190662;
                                              }
                                              std::basic_string_view<char,_std::char_traits<char>_>
                                              ::basic_string_view(in_stack_fffffffffffff4a0,
                                                                  (char *)CONCAT44(
                                                  in_stack_fffffffffffff49c,
                                                  CONCAT13(in_stack_fffffffffffff49b,
                                                           CONCAT12(in_stack_fffffffffffff49a,
                                                                    in_stack_fffffffffffff498))));
                                              flag_07._M_str = (char *)in_stack_fffffffffffff4c8;
                                              flag_07._M_len = (size_t)in_stack_fffffffffffff4c0;
                                              bVar8 = ArgParser::TryParseFlag
                                                                ((ArgParser *)sVar14._M_len,flag_07)
                                              ;
                                              if (bVar8) {
                                                puts(
                                                  "Bloaty McBloatface: a size profiler for binaries.\n\nUSAGE: bloaty [OPTION]... FILE... [-- BASE_FILE...]\n\nOptions:\n\n  --csv              Output in CSV format instead of human-readable.\n  --tsv              Output in TSV format instead of human-readable.\n  -c FILE            Load configuration from <file>.\n  -d SOURCE,SOURCE   Comma-separated list of sources to scan.\n  --debug-file=FILE  Use this file for debug symbols and/or symbol table.\n  --source-map=ID=FILE\n                     Use this source map file for the binary. The ID can be\n                     the build ID (or Wasm sourceMappingURL) or the file path\n                     as specified in the command line.\n                     Currently only supported for Wasm.\n  -C MODE            How to demangle symbols.  Possible values are:\n  --demangle=MODE      --demangle=none   no demangling, print raw symbols\n                       --demangle=short  demangle, but omit arg/return types\n                       --demangle=full   print full demangled type\n                     The default is --demangle=short.\n  --disassemble=FUNCTION\n                     Disassemble this function (EXPERIMENTAL)\n  --domain=DOMAIN    Which domains to show.  Possible values are:\n                       --domain=vm\n                       --domain=file\n                       --domain=both (the default)\n  -n NUM             How many rows to show per level before collapsing\n                     other keys into \'[Other]\'.  Set to \'0\' for unlimited.\n                     Defaults to 20.\n  -s SORTBY          Whether to sort by VM or File size.  Possible values\n                     are:\n                       -s vm\n                       -s file\n                       -s both (the default: sorts by max(vm, file)).\n  -w                 Wide output; don\'t truncate long labels.\n  --help             Display this message and exit.\n  --list-sources     Show a list of available sources and exit.\n  --source-filter=PATTERN\n                     Only show keys with names matching this pattern.\n\nOptions for deb..." /* TRUNCATED STRING LITERAL */
                                                  );
                                                local_1 = 0;
                                                goto LAB_00190662;
                                              }
                                              std::basic_string_view<char,_std::char_traits<char>_>
                                              ::basic_string_view(in_stack_fffffffffffff4a0,
                                                                  (char *)CONCAT44(
                                                  in_stack_fffffffffffff49c,
                                                  CONCAT13(in_stack_fffffffffffff49b,
                                                           CONCAT12(in_stack_fffffffffffff49a,
                                                                    in_stack_fffffffffffff498))));
                                              flag_08._M_str = (char *)in_stack_fffffffffffff4c8;
                                              flag_08._M_len = (size_t)in_stack_fffffffffffff4c0;
                                              bVar8 = ArgParser::TryParseFlag
                                                                ((ArgParser *)sVar14._M_len,flag_08)
                                              ;
                                              if (bVar8) {
                                                printf("Bloaty McBloatface 1.1\n");
                                                exit(0);
                                              }
                                              sVar12 = ArgParser::Arg((ArgParser *)
                                                                      CONCAT44(
                                                  in_stack_fffffffffffff494,
                                                  in_stack_fffffffffffff490));
                                              in_stack_fffffffffffff4f0 = (Options *)sVar12._M_str;
                                              local_980 = sVar12;
                                              std::basic_string_view<char,_std::char_traits<char>_>
                                              ::basic_string_view(in_stack_fffffffffffff4a0,
                                                                  (char *)CONCAT44(
                                                  in_stack_fffffffffffff49c,
                                                  CONCAT13(in_stack_fffffffffffff49b,
                                                           CONCAT12(in_stack_fffffffffffff49a,
                                                                    in_stack_fffffffffffff498))));
                                              text_00._M_str = (char *)in_stack_fffffffffffff4c0;
                                              text_00._M_len = sVar14._M_len;
                                              prefix._M_str._0_7_ = in_stack_fffffffffffff4b0;
                                              prefix._M_len = (size_t)in_stack_fffffffffffff4a8;
                                              prefix._M_str._7_1_ = in_stack_fffffffffffff4b7;
                                              bVar8 = absl::StartsWith(text_00,prefix);
                                              pAVar15 = (Arg *)sVar14._M_len;
                                              if (bVar8) {
                                                if ((local_2 & 1) == 0) {
                                                  std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view(in_stack_fffffffffffff4a0,
                                                                    (char *)CONCAT44(
                                                  in_stack_fffffffffffff49c,
                                                  CONCAT13(in_stack_fffffffffffff49b,
                                                           CONCAT12(in_stack_fffffffffffff49a,
                                                                    in_stack_fffffffffffff498))));
                                                  sVar13 = ArgParser::Arg((ArgParser *)
                                                                          CONCAT44(
                                                  in_stack_fffffffffffff494,
                                                  in_stack_fffffffffffff490));
                                                  absl::substitute_internal::Arg::Arg
                                                            (local_9f0,sVar13);
                                                  format_04._M_str =
                                                       (char *)in_stack_fffffffffffff4c8;
                                                  format_04._M_len =
                                                       (size_t)in_stack_fffffffffffff4c0;
                                                  absl::Substitute_abi_cxx11_(format_04,pAVar15);
                                                  std::__cxx11::string::c_str();
                                                  Throw((char *)in_stack_fffffffffffff4a0,
                                                        in_stack_fffffffffffff49c);
                                                }
                                                ArgParser::ConsumeAndSaveArg
                                                          ((ArgParser *)
                                                           CONCAT44(in_stack_fffffffffffff494,
                                                                    in_stack_fffffffffffff490));
                                              }
                                              else if ((local_29 & 1) == 0) {
                                                in_stack_fffffffffffff4a8 = local_20;
                                                sVar14 = ArgParser::ConsumeArg
                                                                   ((ArgParser *)
                                                                    CONCAT44(
                                                  in_stack_fffffffffffff494,
                                                  in_stack_fffffffffffff490));
                                                in_stack_fffffffffffff598 =
                                                     (ArgParser *)sVar14._M_len;
                                                in_stack_fffffffffffff4b0 = sVar14._M_str._0_7_;
                                                in_stack_fffffffffffff4b7 = sVar14._M_str._7_1_;
                                                in_stack_fffffffffffff4a0 =
                                                     (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&stack0xfffffffffffff597;
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::
                                                string<std::basic_string_view<char,std::char_traits<char>>,void>
                                                          ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sVar13._M_str,in_stack_fffffffffffff4c8,
                                                  in_stack_fffffffffffff4c0);
                                                Options::add_filename
                                                          ((Options *)
                                                           CONCAT44(in_stack_fffffffffffff494,
                                                                    in_stack_fffffffffffff490),
                                                           (string *)
                                                           CONCAT44(in_stack_fffffffffffff48c,
                                                                    in_stack_fffffffffffff488));
                                                std::__cxx11::string::~string
                                                          ((string *)&stack0xfffffffffffff5a8);
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)
                                                           &stack0xfffffffffffff597);
                                              }
                                              else {
                                                *(undefined1 *)(local_28 + 5) = 1;
                                                in_stack_fffffffffffff4c8 = local_20;
                                                sVar13 = ArgParser::ConsumeArg
                                                                   ((ArgParser *)
                                                                    CONCAT44(
                                                  in_stack_fffffffffffff494,
                                                  in_stack_fffffffffffff490));
                                                in_stack_fffffffffffff5d8 =
                                                     (ArgParser *)sVar13._M_str;
                                                in_stack_fffffffffffff4c0 =
                                                     (allocator<char> *)&stack0xfffffffffffff5cf;
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::
                                                string<std::basic_string_view<char,std::char_traits<char>>,void>
                                                          ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sVar13._M_str,in_stack_fffffffffffff4c8,
                                                  in_stack_fffffffffffff4c0);
                                                Options::add_base_filename
                                                          ((Options *)
                                                           CONCAT44(in_stack_fffffffffffff494,
                                                                    in_stack_fffffffffffff490),
                                                           (string *)
                                                           CONCAT44(in_stack_fffffffffffff48c,
                                                                    in_stack_fffffffffffff488));
                                                std::__cxx11::string::~string
                                                          ((string *)&stack0xfffffffffffff5e0);
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)
                                                           &stack0xfffffffffffff5cf);
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    goto LAB_0018e97d;
                  }
                }
                local_508 = local_78._M_len;
                local_500 = local_78._M_str;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffff4a0,
                           (char *)CONCAT44(in_stack_fffffffffffff49c,
                                            CONCAT13(in_stack_fffffffffffff49b,
                                                     CONCAT12(in_stack_fffffffffffff49a,
                                                              in_stack_fffffffffffff498))));
                __x._M_str = (char *)in_stack_fffffffffffff4c0;
                __x._M_len = sVar14._M_len;
                __y._M_str._0_7_ = in_stack_fffffffffffff4b0;
                __y._M_len = (size_t)in_stack_fffffffffffff4a8;
                __y._M_str._7_1_ = in_stack_fffffffffffff4b7;
                bVar8 = std::operator==(__x,__y);
                if (bVar8) {
                  Options::set_demangle
                            ((Options *)
                             CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                             in_stack_fffffffffffff48c);
                }
                else {
                  local_528 = local_78._M_len;
                  local_520 = local_78._M_str;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffff4a0,
                             (char *)CONCAT44(in_stack_fffffffffffff49c,
                                              CONCAT13(in_stack_fffffffffffff49b,
                                                       CONCAT12(in_stack_fffffffffffff49a,
                                                                in_stack_fffffffffffff498))));
                  __x_00._M_str = (char *)in_stack_fffffffffffff4c0;
                  __x_00._M_len = sVar14._M_len;
                  __y_00._M_str._0_7_ = in_stack_fffffffffffff4b0;
                  __y_00._M_len = (size_t)in_stack_fffffffffffff4a8;
                  __y_00._M_str._7_1_ = in_stack_fffffffffffff4b7;
                  bVar8 = std::operator==(__x_00,__y_00);
                  if (bVar8) {
                    Options::set_demangle
                              ((Options *)
                               CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                               in_stack_fffffffffffff48c);
                  }
                  else {
                    local_548 = local_78._M_len;
                    local_540 = local_78._M_str;
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (in_stack_fffffffffffff4a0,
                               (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                CONCAT13(in_stack_fffffffffffff49b,
                                                         CONCAT12(in_stack_fffffffffffff49a,
                                                                  in_stack_fffffffffffff498))));
                    __x_01._M_str = (char *)in_stack_fffffffffffff4c0;
                    __x_01._M_len = sVar14._M_len;
                    __y_01._M_str._0_7_ = in_stack_fffffffffffff4b0;
                    __y_01._M_len = (size_t)in_stack_fffffffffffff4a8;
                    __y_01._M_str._7_1_ = in_stack_fffffffffffff4b7;
                    bVar8 = std::operator==(__x_01,__y_01);
                    pAVar15 = (Arg *)sVar14._M_len;
                    if (!bVar8) {
                      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                (in_stack_fffffffffffff4a0,
                                 (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                  CONCAT13(in_stack_fffffffffffff49b,
                                                           CONCAT12(in_stack_fffffffffffff49a,
                                                                    in_stack_fffffffffffff498))));
                      local_5c8 = local_78._M_len;
                      pcStack_5c0 = local_78._M_str;
                      value_01._M_str = local_78._M_str;
                      value_01._M_len = local_78._M_len;
                      absl::substitute_internal::Arg::Arg(local_5b8,value_01);
                      format_01._M_str = (char *)in_stack_fffffffffffff4c8;
                      format_01._M_len = (size_t)in_stack_fffffffffffff4c0;
                      absl::Substitute_abi_cxx11_(format_01,pAVar15);
                      std::__cxx11::string::c_str();
                      Throw((char *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff49c);
                    }
                    Options::set_demangle
                              ((Options *)
                               CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                               in_stack_fffffffffffff48c);
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_0018e97d;
    }
    if ((local_29 & 1) != 0) {
      Throw((char *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff49c);
    }
    local_29 = 1;
  } while( true );
}

Assistant:

bool DoParseOptions(bool skip_unknown, int* argc, char** argv[],
                    Options* options, OutputOptions* output_options) {
  bool saw_separator = false;
  ArgParser args(argc, argv);
  string_view option;
  int int_option;
  uint64_t uint64_option;
  bool has_domain = false;

  while (!args.IsDone()) {
    if (args.TryParseFlag("--")) {
      if (saw_separator) {
        THROW("'--' option should only be specified once");
      }
      saw_separator = true;
    } else if (args.TryParseFlag("--csv")) {
      output_options->output_format = OutputFormat::kCSV;
    } else if (args.TryParseFlag("--tsv")) {
      output_options->output_format = OutputFormat::kTSV;
    } else if (args.TryParseFlag("--raw-map")) {
      options->set_dump_raw_map(true);
    } else if (args.TryParseOption("-c", &option)) {
      std::ifstream input_file(std::string(option), std::ios::in);
      if (!input_file.is_open()) {
        THROWF("couldn't open file $0", option);
      }
      google::protobuf::io::IstreamInputStream stream(&input_file);
      if (!google::protobuf::TextFormat::Merge(&stream, options)) {
        THROWF("error parsing configuration out of file $0", option);
      }
    } else if (args.TryParseOption("-d", &option)) {
      std::vector<std::string> names = absl::StrSplit(option, ',');
      for (const auto& name : names) {
        options->add_data_source(name);
      }
    } else if (args.TryParseOption("-C", &option) ||
               args.TryParseOption("--demangle", &option)) {
      if (option == "none") {
        options->set_demangle(Options::DEMANGLE_NONE);
      } else if (option == "short") {
        options->set_demangle(Options::DEMANGLE_SHORT);
      } else if (option == "full") {
        options->set_demangle(Options::DEMANGLE_FULL);
      } else {
        THROWF("unknown value for --demangle: $0", option);
      }
    } else if (args.TryParseOption("--debug-file", &option)) {
      options->add_debug_filename(std::string(option));
    } else if (args.TryParseUint64Option("--debug-fileoff", &uint64_option)) {
      if (options->has_debug_fileoff()) {
        THROW("currently we only support a single debug fileoff");
      }
      options->set_debug_fileoff(uint64_option);
    } else if (args.TryParseUint64Option("--debug-vmaddr", &uint64_option)) {
      if (options->has_debug_vmaddr()) {
        THROW("currently we only support a single debug vmaddr");
      }
      options->set_debug_vmaddr(uint64_option);
    } else if (args.TryParseOption("--disassemble", &option)) {
      options->mutable_disassemble_function()->assign(std::string(option));
    } else if (args.TryParseIntegerOption("-n", &int_option)) {
      if (int_option == 0) {
        options->set_max_rows_per_level(INT64_MAX);
      } else {
        options->set_max_rows_per_level(int_option);
      }
    } else if (args.TryParseOption("--domain", &option)) {
      has_domain = true;
      if (option == "vm") {
        show = output_options->show = ShowDomain::kShowVM;
      } else if (option == "file") {
        show = output_options->show = ShowDomain::kShowFile;
      } else if (option == "both") {
        show = output_options->show = ShowDomain::kShowBoth;
      } else {
        THROWF("unknown value for --domain: $0", option);
      }
    } else if (args.TryParseOption("-s", &option)) {
      if (option == "vm") {
        options->set_sort_by(Options::SORTBY_VMSIZE);
      } else if (option == "file") {
        options->set_sort_by(Options::SORTBY_FILESIZE);
      } else if (option == "both") {
        options->set_sort_by(Options::SORTBY_BOTH);
      } else {
        THROWF("unknown value for -s: $0", option);
      }
    } else if (args.TryParseOption("--source-filter", &option)) {
      options->set_source_filter(std::string(option));
    } else if (args.TryParseOption("--source-map", &option)) {
      options->add_source_map(std::string(option));
    } else if (args.TryParseFlag("-v")) {
      options->set_verbose_level(1);
    } else if (args.TryParseFlag("-vv")) {
      options->set_verbose_level(2);
    } else if (args.TryParseFlag("-vvv")) {
      options->set_verbose_level(3);
    } else if (args.TryParseFlag("-w")) {
      output_options->max_label_len = SIZE_MAX;
    } else if (args.TryParseFlag("--list-sources")) {
      for (const auto& source : data_sources) {
        fprintf(stderr, "%s %s\n", FixedWidthString(source.name, 15).c_str(),
                source.description);
      }
      return false;
    } else if (args.TryParseFlag("--help")) {
      puts(usage);
      return false;
    } else if (args.TryParseFlag("--version")) {
      printf("Bloaty McBloatface 1.1\n");
      exit(0);
    } else if (absl::StartsWith(args.Arg(), "-")) {
      if (skip_unknown) {
        args.ConsumeAndSaveArg();
      } else {
        THROWF("Unknown option: $0", args.Arg());
      }
    } else {
      if (saw_separator) {
        output_options->showAllSizesCSV = true;
        options->add_base_filename(std::string(args.ConsumeArg()));
      } else {
        options->add_filename(std::string(args.ConsumeArg()));
      }
    }
  }

  if (options->data_source_size() == 0 &&
      !options->has_disassemble_function()) {
    // Default when no sources are specified.
    options->add_data_source("sections");
  }

  if (has_domain && !options->has_sort_by()) {
    // Default to sorting by what we are showing.
    switch (output_options->show) {
      case ShowDomain::kShowFile:
        options->set_sort_by(Options::SORTBY_FILESIZE);
        break;
      case ShowDomain::kShowVM:
        options->set_sort_by(Options::SORTBY_VMSIZE);
        break;
      case ShowDomain::kShowBoth:
        options->set_sort_by(Options::SORTBY_BOTH);
        break;
    }
  }

  return true;
}